

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word * Gia_ObjComputeTruthTableCut(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves)

{
  word *pwVar1;
  ulong *puVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  ulong uVar10;
  word *pwVar11;
  word Fill;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  word *pwVar18;
  word *pwVar19;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vTtMemory != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x168,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  if (p->nTtVars < vLeaves->nSize) {
    __assert_fail("Vec_IntSize(vLeaves) <= p->nTtVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x169,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  if (p->vTtNums->nSize < p->nObjs) {
    Vec_IntFillExtra(p->vTtNums,p->nObjs,-1000000000);
  }
  pGVar5 = p->pObjs;
  if ((pGVar5 <= pRoot) && (pRoot < pGVar5 + p->nObjs)) {
    Gia_ObjCollectInternalCut
              (p,(int)((ulong)((long)pRoot - (long)pGVar5) >> 2) * -0x55555555,vLeaves);
    iVar13 = (p->vTtNodes->nSize + 2) * p->nTtWords;
    if (p->vTtMemory->nSize < iVar13) {
      Vec_WrdFillExtra(p->vTtMemory,iVar13,Fill);
    }
    pVVar6 = p->vTtNodes;
    iVar13 = pVVar6->nSize;
    if (1 < (long)iVar13) {
      piVar7 = pVVar6->pArray;
      pVVar8 = p->vTtNums;
      uVar15 = 1;
      do {
        iVar3 = piVar7[uVar15];
        lVar17 = (long)iVar3;
        if ((lVar17 < 0) || (iVar14 = pVVar8->nSize, iVar14 <= iVar3)) goto LAB_0073a362;
        piVar9 = pVVar8->pArray;
        if (uVar15 != (uint)piVar9[lVar17]) {
          __assert_fail("i == Gia_ObjNumId(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                        ,0x175,
                        "word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        if (p->nObjs <= iVar3) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar10 = *(ulong *)(p->pObjs + lVar17);
        uVar12 = iVar3 - ((uint)uVar10 & 0x1fffffff);
        if (((((int)uVar12 < 0) || (iVar14 <= (int)uVar12)) ||
            (uVar16 = iVar3 - ((uint)(uVar10 >> 0x20) & 0x1fffffff), (int)uVar16 < 0)) ||
           (iVar14 <= (int)uVar16)) goto LAB_0073a362;
        pwVar11 = p->vTtMemory->pArray;
        iVar3 = p->nTtWords;
        iVar14 = piVar9[uVar12];
        iVar4 = piVar9[uVar16];
        if (iVar14 < 1) {
          uVar16 = -iVar14;
          uVar12 = p->vTtInputs->nSize;
          if (uVar12 == uVar16 || SBORROW4(uVar12,uVar16) != (int)(uVar12 + iVar14) < 0)
          goto LAB_0073a3bf;
          pwVar18 = (word *)p->vTtInputs->pArray[uVar16];
        }
        else {
          pwVar18 = pwVar11 + iVar14 * iVar3;
        }
        if (iVar4 < 1) {
          uVar16 = -iVar4;
          uVar12 = p->vTtInputs->nSize;
          if (uVar12 == uVar16 || SBORROW4(uVar12,uVar16) != (int)(uVar12 + iVar4) < 0) {
LAB_0073a3bf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pwVar19 = (word *)p->vTtInputs->pArray[uVar16];
        }
        else {
          pwVar19 = pwVar11 + iVar4 * iVar3;
        }
        iVar14 = (int)uVar15;
        pwVar1 = pwVar11 + (long)(iVar3 * iVar14) + (long)iVar3;
        if (((uint)uVar10 >> 0x1d & 1) == 0) {
          if ((uVar10 >> 0x3d & 1) == 0) {
            if (0 < iVar3) {
              lVar17 = 0;
              do {
                puVar2 = (ulong *)((long)pwVar11 + lVar17 + (long)(iVar3 * iVar14) * 8);
                *puVar2 = *(ulong *)((long)pwVar19 + lVar17) & *(ulong *)((long)pwVar18 + lVar17);
                lVar17 = lVar17 + 8;
              } while (puVar2 + 1 < pwVar1);
            }
          }
          else if (0 < iVar3) {
            lVar17 = 0;
            do {
              puVar2 = (ulong *)((long)pwVar11 + lVar17 + (long)(iVar3 * iVar14) * 8);
              *puVar2 = ~*(ulong *)((long)pwVar19 + lVar17) & *(ulong *)((long)pwVar18 + lVar17);
              lVar17 = lVar17 + 8;
            } while (puVar2 + 1 < pwVar1);
          }
        }
        else if ((uVar10 >> 0x3d & 1) == 0) {
          if (0 < iVar3) {
            lVar17 = 0;
            do {
              puVar2 = (ulong *)((long)pwVar11 + lVar17 + (long)(iVar3 * iVar14) * 8);
              *puVar2 = ~*(ulong *)((long)pwVar18 + lVar17) & *(ulong *)((long)pwVar19 + lVar17);
              lVar17 = lVar17 + 8;
            } while (puVar2 + 1 < pwVar1);
          }
        }
        else if (0 < iVar3) {
          lVar17 = 0;
          do {
            puVar2 = (ulong *)((long)pwVar11 + lVar17 + (long)(iVar3 * iVar14) * 8);
            *puVar2 = ~(*(ulong *)((long)pwVar19 + lVar17) | *(ulong *)((long)pwVar18 + lVar17));
            lVar17 = lVar17 + 8;
          } while (puVar2 + 1 < pwVar1);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (long)iVar13);
    }
    pGVar5 = p->pObjs;
    if ((pGVar5 <= pRoot) && (pRoot < pGVar5 + p->nObjs)) {
      uVar12 = (int)((long)pRoot - (long)pGVar5 >> 2) * -0x55555555;
      if (((int)uVar12 < 0) || (pVVar8 = p->vTtNums, pVVar8->nSize <= (int)uVar12)) {
LAB_0073a362:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pwVar11 = p->vTtMemory->pArray;
      iVar13 = p->nTtWords;
      piVar7 = pVVar8->pArray;
      iVar3 = piVar7[uVar12 & 0x7fffffff];
      if (0 < vLeaves->nSize) {
        piVar9 = vLeaves->pArray;
        lVar17 = 0;
        do {
          iVar14 = piVar9[lVar17];
          if (((long)iVar14 < 0) || (pVVar8->nSize <= iVar14)) goto LAB_0073a343;
          piVar7[iVar14] = -1000000000;
          lVar17 = lVar17 + 1;
        } while (lVar17 < vLeaves->nSize);
      }
      if (1 < pVVar6->nSize) {
        piVar9 = pVVar6->pArray;
        lVar17 = 1;
        do {
          iVar14 = piVar9[lVar17];
          if (((long)iVar14 < 0) || (pVVar8->nSize <= iVar14)) {
LAB_0073a343:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar7[iVar14] = -1000000000;
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar6->nSize);
      }
      return pwVar11 + (long)iVar3 * (long)iVar13;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

word * Gia_ObjComputeTruthTableCut( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pTemp;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i, iObj, Id0, Id1;
    assert( p->vTtMemory != NULL );
    assert( Vec_IntSize(vLeaves) <= p->nTtVars );
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), -ABC_INFINITY );
    // collect internal nodes
    Gia_ObjCollectInternalCut( p, Gia_ObjId(p, pRoot), vLeaves );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
    {
        assert( i == Gia_ObjNumId(p, iObj) );
        pTemp   = Gia_ManObj( p, iObj );
        pTruth  = Gla_ObjTruthNodeId( p, i );  
        pTruthL = pTruth + p->nTtWords;
        Id0 = Gia_ObjNumId( p, Gia_ObjFaninId0(pTemp, iObj) );
        Id1 = Gia_ObjNumId( p, Gia_ObjFaninId1(pTemp, iObj) );
        pTruth0 = (Id0 > 0) ? Gla_ObjTruthNodeId(p, Id0) : Gla_ObjTruthElem(p, -Id0);
        pTruth1 = (Id1 > 0) ? Gla_ObjTruthNodeId(p, Id1) : Gla_ObjTruthElem(p, -Id1);
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    pTruth = Gla_ObjTruthNode( p, pRoot );
    // unmark leaves marked by Gia_ObjCollectInternal()
    Vec_IntForEachEntry( vLeaves, iObj, i )
        Gia_ObjResetNumId( p, iObj );
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
        Gia_ObjResetNumId( p, iObj );
    return pTruth;
}